

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  ostream *poVar5;
  pointer puVar6;
  long lVar7;
  long lVar8;
  string_view str;
  string_view str_00;
  string local_1b0;
  ostringstream e;
  
  str._M_str = (prop->_M_dataplus)._M_p;
  str._M_len = prop->_M_string_length;
  bVar2 = cmHasLiteralPrefix<25ul>(str,(char (*) [25])0x623a33);
  if (bVar2) {
    cVar4 = GetProperty(this,prop);
    if (cVar4.Value == (string *)0x0) {
      return;
    }
    bVar2 = false;
LAB_0028aab2:
    anon_unknown.dwarf_9b0b28::CheckLINK_INTERFACE_LIBRARIES(prop,cVar4.Value,context,bVar2);
    return;
  }
  str_00._M_str = (prop->_M_dataplus)._M_p;
  str_00._M_len = prop->_M_string_length;
  bVar2 = cmHasLiteralPrefix<34ul>(str_00,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
  if (bVar2) {
    cVar4 = GetProperty(this,prop);
    if (cVar4.Value == (string *)0x0) {
      return;
    }
    bVar2 = true;
    goto LAB_0028aab2;
  }
  bVar2 = std::operator==(prop,"INTERFACE_LINK_LIBRARIES");
  if (bVar2) {
    cVar4 = GetProperty(this,prop);
    if (cVar4.Value == (string *)0x0) {
      return;
    }
    if (((anonymous_namespace)::
         CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
                                     ::keys), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)
                 (anonymous_namespace)::
                 CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                 "(^|;)(debug|optimized|general)(;|$)");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   (anonymous_namespace)::
                   CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::
                           keys);
    }
    bVar2 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       (anonymous_namespace)::
                       CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                       cVar4.Value);
    if (!bVar2) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,
                             "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \""
                            );
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&local_1b0,
               (RegularExpressionMatch *)
               (anonymous_namespace)::
               CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,2);
    poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
    std::operator<<(poVar5,
                    "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                   );
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1b0);
    goto LAB_0028ac9d;
  }
  bVar2 = std::operator==(prop,"IMPORTED_GLOBAL");
  if (!bVar2) {
    return;
  }
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget != true) {
    return;
  }
  puVar6 = (context->ImportedTargetsOwned).
           super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (context->ImportedTargetsOwned).
           super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar1 - (long)puVar6;
  for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((puVar6->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
        super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) goto LAB_0028ac3f;
    if (puVar6[1]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
        super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
      puVar6 = puVar6 + 1;
      goto LAB_0028ac3f;
    }
    if (puVar6[2]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
        super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
      puVar6 = puVar6 + 2;
      goto LAB_0028ac3f;
    }
    if (puVar6[3]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
        super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
      puVar6 = puVar6 + 3;
      goto LAB_0028ac3f;
    }
    puVar6 = puVar6 + 4;
    lVar7 = lVar7 + -0x20;
  }
  lVar7 = lVar7 >> 3;
  if (lVar7 == 1) {
LAB_0028ac26:
    if ((puVar6->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
        super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
      puVar6 = puVar1;
    }
LAB_0028ac3f:
    if (puVar6 != puVar1) {
      return;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0028ac1d:
      if ((puVar6->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
          super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
        puVar6 = puVar6 + 1;
        goto LAB_0028ac26;
      }
      goto LAB_0028ac3f;
    }
    if (lVar7 == 3) {
      if ((puVar6->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
          super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
        puVar6 = puVar6 + 1;
        goto LAB_0028ac1d;
      }
      goto LAB_0028ac3f;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar5 = std::operator<<((ostream *)&e,"Attempt to promote imported target \"");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->Name);
  std::operator<<(poVar5,
                  "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
                 );
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1b0);
LAB_0028ac9d:
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, false);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, true);
    }
  } else if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (cmValue value = this->GetProperty(prop)) {
      CheckINTERFACE_LINK_LIBRARIES(*value, context);
    }
  } else if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      CheckIMPORTED_GLOBAL(this, context);
    }
  }
}